

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::GeneratedExtensionFinder::Find
          (GeneratedExtensionFinder *this,int number,ExtensionInfo *output)

{
  MessageLite *pMVar1;
  EnumValidityFuncWithArg *pEVar2;
  void *pvVar3;
  LazyEagerVerifyFnType p_Var4;
  int iVar5;
  FieldType FVar6;
  bool bVar7;
  bool bVar8;
  LazyAnnotation LVar9;
  ExtensionInfo *pEVar10;
  
  pEVar10 = anon_unknown_58::FindRegisteredExtension(this->extendee_,number);
  if (pEVar10 != (ExtensionInfo *)0x0) {
    pMVar1 = pEVar10->message;
    iVar5 = pEVar10->number;
    FVar6 = pEVar10->type;
    bVar7 = pEVar10->is_repeated;
    bVar8 = pEVar10->is_packed;
    LVar9 = pEVar10->is_lazy;
    pEVar2 = (pEVar10->field_6).enum_validity_check.func;
    pvVar3 = (pEVar10->field_6).enum_validity_check.arg;
    p_Var4 = pEVar10->lazy_eager_verify_func;
    output->descriptor = pEVar10->descriptor;
    output->lazy_eager_verify_func = p_Var4;
    (output->field_6).enum_validity_check.func = pEVar2;
    (output->field_6).enum_validity_check.arg = pvVar3;
    output->message = pMVar1;
    output->number = iVar5;
    output->type = FVar6;
    output->is_repeated = bVar7;
    output->is_packed = bVar8;
    output->is_lazy = LVar9;
  }
  return pEVar10 != (ExtensionInfo *)0x0;
}

Assistant:

bool GeneratedExtensionFinder::Find(int number, ExtensionInfo* output) {
  const ExtensionInfo* extension = FindRegisteredExtension(extendee_, number);
  if (extension == nullptr) {
    return false;
  } else {
    *output = *extension;
    return true;
  }
}